

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::InvSqrtOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < 0.4) || (3.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,0.4);
    *inMax = 1.0 / fVar1;
    fVar1 = deFloatMin(outMax,3.0);
    *inMin = 1.0 / fVar1;
    *inMin = *inMin * *inMin;
    *inMax = *inMax * *inMax;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons
		const float rangeMin = 0.4f;
		const float rangeMax = 3.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMax = 1.0f/deFloatMax(outMin, rangeMin);
		inMin = 1.0f/deFloatMin(outMax, rangeMax);

		inMin *= inMin;
		inMax *= inMax;

		return true;
	}